

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImgProcessor.cpp
# Opt level: O1

ImgProcessor * __thiscall pobr::imgProcessing::ImgProcessor::getBinarizedImg(ImgProcessor *this)

{
  Mat *in_RSI;
  Mat *pMVar1;
  ImgProcessor local_70;
  
  assertIsReady((ImgProcessor *)in_RSI);
  cv::Mat::Mat(&this->img,in_RSI);
  processPreEnhance(&local_70,in_RSI,(bool *)this);
  pMVar1 = &local_70.img;
  cv::Mat::operator=(&this->img,pMVar1);
  cv::Mat::~Mat(&local_70.img);
  processBinarize(&local_70,pMVar1,(bool *)this);
  pMVar1 = &local_70.img;
  cv::Mat::operator=(&this->img,pMVar1);
  cv::Mat::~Mat(&local_70.img);
  processBinaryEnhance(&local_70,pMVar1,(bool *)this);
  cv::Mat::operator=(&this->img,&local_70.img);
  cv::Mat::~Mat(&local_70.img);
  return this;
}

Assistant:

const cv::Mat
ImgProcessor::getBinarizedImg()
const
{
    this->assertIsReady();

    auto img = this->img;

    img = this->processPreEnhance(img);
    img = this->processBinarize(img);
    img = this->processBinaryEnhance(img);

    return img;
}